

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

bool __thiscall
GdlSlotRefExpression::CheckRuleExpression
          (GdlSlotRefExpression *this,GrcFont *param_2,GdlRenderer *param_3,
          vector<bool,_std::allocator<bool>_> *vfLb,vector<bool,_std::allocator<bool>_> *vfIns,
          vector<bool,_std::allocator<bool>_> *vfDel,bool fValue,bool fValueIsInputSlot)

{
  int iVar1;
  reference rVar2;
  size_type_conflict sVar3;
  long in_RDI;
  reference rVar4;
  byte in_stack_00000008;
  byte in_stack_00000010;
  string staSlotNumber;
  uint7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  bool bVar5;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  undefined1 uVar6;
  undefined8 in_stack_fffffffffffffdd8;
  int iVar7;
  GrcErrorList *in_stack_fffffffffffffde0;
  GrcErrorList *this_00;
  bool local_201;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  reference local_180;
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  reference local_128;
  string local_118 [39];
  undefined1 local_f1 [33];
  reference local_d0;
  undefined4 local_bc;
  string local_b8 [55];
  allocator local_81;
  string local_80 [32];
  string local_60 [38];
  byte local_3a;
  byte local_39;
  byte local_1;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  local_39 = in_stack_00000008 & 1;
  local_3a = in_stack_00000010 & 1;
  std::__cxx11::to_string(iVar7);
  if (0 < *(int *)(in_RDI + 0x34)) {
    iVar1 = *(int *)(in_RDI + 0x34);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    if (iVar1 <= (int)sVar3) {
      local_201 = false;
      if ((local_39 & 1) != 0) {
        local_d0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffffdb0,
                              CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
        local_201 = std::_Bit_reference::operator_cast_to_bool(&local_d0);
      }
      rVar4._M_mask = (_Bit_type)in_stack_fffffffffffffdc0;
      rVar4._M_p = (_Bit_type *)in_stack_fffffffffffffdc8;
      if (local_201 == false) {
        if (((local_39 & 1) == 0) || (uVar6 = false, (local_3a & 1) != 0)) {
          rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (in_stack_fffffffffffffdb0,
                             CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          local_128 = rVar4;
          uVar6 = std::_Bit_reference::operator_cast_to_bool(&local_128);
        }
        rVar2._M_mask = local_180._M_mask;
        rVar2._M_p = local_180._M_p;
        if ((bool)uVar6 == false) {
          bVar5 = false;
          if (((local_39 & 1) != 0) && (bVar5 = false, local_180 = rVar2, (local_3a & 1) == 0)) {
            local_180 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  (in_stack_fffffffffffffdb0,(ulong)in_stack_fffffffffffffda8);
            bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_180);
          }
          if (bVar5 == false) {
            local_1 = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_1a0,"Illegal reference to deleted slot: @",&local_1a1);
            std::__cxx11::string::string(local_1c8,local_60);
            GrcErrorList::AddError
                      (in_stack_fffffffffffffde0,iVar7,
                       (GdlObject *)CONCAT17(uVar6,in_stack_fffffffffffffdd0),(string *)rVar4._M_p,
                       (string *)rVar4._M_mask);
            std::__cxx11::string::~string(local_1c8);
            std::__cxx11::string::~string(local_1a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
            local_1 = 0;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_148,"Illegal reference to inserted slot: @",&local_149)
          ;
          std::__cxx11::string::string(local_170,local_60);
          GrcErrorList::AddError
                    (in_stack_fffffffffffffde0,iVar7,
                     (GdlObject *)CONCAT17(uVar6,in_stack_fffffffffffffdd0),(string *)rVar4._M_p,
                     (string *)rVar4._M_mask);
          std::__cxx11::string::~string(local_170);
          std::__cxx11::string::~string(local_148);
          std::allocator<char>::~allocator((allocator<char> *)&local_149);
          local_1 = 0;
        }
      }
      else {
        iVar7 = (int)((ulong)(in_RDI + 8) >> 0x20);
        this_00 = (GrcErrorList *)local_f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_f1 + 1),"Illegal reference to line-break slot: @",
                   (allocator *)this_00);
        std::__cxx11::string::string(local_118,local_60);
        GrcErrorList::AddError
                  (this_00,iVar7,
                   (GdlObject *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                   in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        std::__cxx11::string::~string(local_118);
        std::__cxx11::string::~string((string *)(local_f1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_f1);
        local_1 = 0;
      }
      goto LAB_0018f987;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Slot reference out of range: @",&local_81);
  std::__cxx11::string::string(local_b8,local_60);
  GrcErrorList::AddError
            (in_stack_fffffffffffffde0,iVar7,
             (GdlObject *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_1 = 0;
LAB_0018f987:
  local_bc = 1;
  std::__cxx11::string::~string(local_60);
  return (bool)(local_1 & 1);
}

Assistant:

bool GdlSlotRefExpression::CheckRuleExpression(GrcFont * /*pfont*/, GdlRenderer * /*prndr*/,
	std::vector<bool> & vfLb, std::vector<bool> & vfIns, std::vector<bool> & vfDel,
	bool fValue, bool fValueIsInputSlot)
{
	auto const staSlotNumber = std::to_string(m_srNumber);

	if (m_srNumber < 1 || m_srNumber > signed(vfLb.size()))
	{
		g_errorList.AddError(2142, this,
			"Slot reference out of range: @",
			staSlotNumber);
		return false;
	}
	else if (fValue && vfLb[m_srNumber - 1])
	{
		//	Eg, attach.to = @2 or comp.X.ref = @2, where @2 is a LB slot
		g_errorList.AddError(2143, this,
			"Illegal reference to line-break slot: @",
			staSlotNumber);
		return false;
	}
	else if ((!fValue || fValueIsInputSlot) && vfIns[m_srNumber - 1])
	{
		//	Eg, @1.bb.width or comp.X.ref = @1, where @1 is being inserted
		g_errorList.AddError(2144, this,
			"Illegal reference to inserted slot: @",
			staSlotNumber);
		return false;
	}
	else if (fValue && !fValueIsInputSlot && vfDel[m_srNumber - 1])
	{
		//	Eg, attach.to = @3, where @3 is being deleted
		g_errorList.AddError(2145, this,
			"Illegal reference to deleted slot: @",
			staSlotNumber);
		return false;
	}
	else
		return true;
}